

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfutureinterface_p.h
# Opt level: O1

void __thiscall
QFutureCallOutEvent::QFutureCallOutEvent
          (QFutureCallOutEvent *this,CallOutType callOutType,int index1,QString *text)

{
  Data *pDVar1;
  
  QEvent::QEvent(&this->super_QEvent,FutureCallOut);
  (this->super_QEvent)._vptr_QEvent = (_func_int **)&PTR__QFutureCallOutEvent_006af620;
  this->callOutType = callOutType;
  this->index1 = index1;
  this->index2 = -1;
  pDVar1 = (text->d).d;
  (this->text).d.d = pDVar1;
  (this->text).d.ptr = (text->d).ptr;
  (this->text).d.size = (text->d).size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  return;
}

Assistant:

QFutureCallOutEvent(CallOutType callOutType, int index1, const QString &text)
        : QEvent(QEvent::FutureCallOut),
          callOutType(callOutType),
          index1(index1),
          index2(-1),
          text(text)
    { }